

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::NearestNeighborsIndex::MergePartialFromCodedStream
          (NearestNeighborsIndex *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  SquaredEuclideanDistance *this_00;
  Type *this_01;
  LinearIndex *this_02;
  SingleKdTreeIndex *this_03;
  pair<int,_int> pVar9;
  char cVar10;
  Limit limit;
  ulong uVar11;
  CodedInputStream *pCVar12;
  
LAB_001dd48f:
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_001dd79c;
        uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_001dd79c:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_001dd4ec;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar6 < 100) {
      if (uVar6 == 1) {
        if (cVar10 == '\b') {
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar2 = *pbVar3;
            uVar11 = (ulong)bVar2;
            uVar8 = (uint32)bVar2;
            if ((char)bVar2 < '\0') goto LAB_001dd7c2;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar8 = 0;
LAB_001dd7c2:
            uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
            if ((long)uVar11 < 0) {
              return false;
            }
          }
          this->numberofdimensions_ = (int32)uVar11;
          goto LAB_001dd48f;
        }
      }
      else if ((uVar6 == 2) && (cVar10 == '\x12')) {
        this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                            (&(this->floatsamples_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = FloatVector::MergePartialFromCodedStream(this_01,input);
LAB_001dd752:
        if (bVar5 == false) {
          return false;
        }
        limit = pVar9.first;
        goto LAB_001dd792;
      }
LAB_001dd4ec:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    }
    else {
      if (uVar6 != 100) {
        if (uVar6 == 0x6e) {
          if (cVar10 == 'r') {
            if (this->_oneof_case_[0] == 0x6e) {
              this_03 = (this->IndexType_).singlekdtreeindex_;
            }
            else {
              clear_IndexType(this);
              this->_oneof_case_[0] = 0x6e;
              this_03 = (SingleKdTreeIndex *)operator_new(0x18);
              SingleKdTreeIndex::SingleKdTreeIndex(this_03);
              (this->IndexType_).singlekdtreeindex_ = this_03;
            }
            puVar4 = input->buffer_;
            if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
              input->buffer_ = puVar4 + 1;
            }
            else {
              iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
              if (iVar7 < 0) {
                return false;
              }
            }
            pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar7);
            if ((long)pVar9 < 0) {
              return false;
            }
            bVar5 = SingleKdTreeIndex::MergePartialFromCodedStream(this_03,input);
            goto LAB_001dd752;
          }
        }
        else if ((uVar6 == 200) && (cVar10 == 'B')) {
          if (this->_oneof_case_[1] != 200) {
            this->_oneof_case_[1] = 200;
            this_00 = (SquaredEuclideanDistance *)operator_new(0x18);
            SquaredEuclideanDistance::SquaredEuclideanDistance(this_00);
            (this->DistanceFunction_).squaredeuclideandistance_ = this_00;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pCVar12 = input;
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = SquaredEuclideanDistance::MergePartialFromCodedStream
                            ((SquaredEuclideanDistance *)pCVar12,input);
          goto LAB_001dd788;
        }
        goto LAB_001dd4ec;
      }
      if (cVar10 != '\"') goto LAB_001dd4ec;
      if (this->_oneof_case_[0] != 100) {
        clear_IndexType(this);
        this->_oneof_case_[0] = 100;
        this_02 = (LinearIndex *)operator_new(0x18);
        LinearIndex::LinearIndex(this_02);
        (this->IndexType_).linearindex_ = this_02;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pCVar12 = input;
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = LinearIndex::MergePartialFromCodedStream((LinearIndex *)pCVar12,input);
LAB_001dd788:
      if (bVar5 == false) {
        return false;
      }
      limit = pVar9.first;
LAB_001dd792:
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,limit);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NearestNeighborsIndex::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NearestNeighborsIndex)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 numberOfDimensions = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &numberofdimensions_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.FloatVector floatSamples = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_floatsamples()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LinearIndex linearIndex = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linearindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_singlekdtreeindex()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
      case 200: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1602u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_squaredeuclideandistance()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NearestNeighborsIndex)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NearestNeighborsIndex)
  return false;
#undef DO_
}